

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprPattern(Fts5Config *pConfig,int bGlob,int iCol,char *zText,Fts5Expr **pp)

{
  long lVar1;
  int iVar2;
  char **pzErr;
  void *pvVar3;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  Fts5Config *in_RDI;
  Fts5Expr **in_R8;
  long in_FS_OFFSET;
  bool bVar4;
  int bAnd;
  int jj;
  int iFirst;
  int i;
  int iOut;
  int rc;
  char *zExpr;
  i64 nText;
  char aSpec [3];
  sqlite3_uint64 in_stack_ffffffffffffff98;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined2 local_b;
  char local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pzErr = (char **)strlen(in_RCX);
  pvVar3 = sqlite3_malloc64(in_stack_ffffffffffffff98);
  local_44 = 0;
  if (pvVar3 == (void *)0x0) {
    local_44 = 7;
  }
  else {
    local_48 = 0;
    local_4c = 0;
    local_50 = 0;
    if (in_ESI == 0) {
      local_b = 0x255f;
      local_9 = '\0';
    }
    else {
      local_b = 0x3f2a;
      local_9 = '[';
    }
    for (; (long)local_4c <= (long)pzErr; local_4c = local_4c + 1) {
      if (((((char **)(long)local_4c == pzErr) || (in_RCX[local_4c] == (char)local_b)) ||
          (in_RCX[local_4c] == local_b._1_1_)) || (in_RCX[local_4c] == local_9)) {
        iVar2 = fts5ExprCountChar(in_RCX + local_50,local_4c - local_50);
        if (2 < iVar2) {
          *(undefined1 *)((long)pvVar3 + (long)local_48) = 0x22;
          local_48 = local_48 + 1;
          for (local_54 = local_50; local_54 < local_4c; local_54 = local_54 + 1) {
            *(char *)((long)pvVar3 + (long)local_48) = in_RCX[local_54];
            iVar2 = local_48 + 1;
            if (in_RCX[local_54] == '\"') {
              *(undefined1 *)((long)pvVar3 + (long)(local_48 + 1)) = 0x22;
              iVar2 = local_48 + 2;
            }
            local_48 = iVar2;
          }
          iVar2 = local_48 + 1;
          *(undefined1 *)((long)pvVar3 + (long)local_48) = 0x22;
          local_48 = local_48 + 2;
          *(undefined1 *)((long)pvVar3 + (long)iVar2) = 0x20;
        }
        if (in_RCX[local_4c] == local_9) {
          iVar2 = local_4c + 2;
          if (in_RCX[local_4c + 1] == '^') {
            iVar2 = local_4c + 3;
          }
          while( true ) {
            local_4c = iVar2;
            bVar4 = false;
            if ((long)local_4c < (long)pzErr) {
              bVar4 = in_RCX[local_4c] != ']';
            }
            if (!bVar4) break;
            iVar2 = local_4c + 1;
          }
        }
        local_50 = local_4c + 1;
      }
    }
    if (local_48 < 1) {
      *in_R8 = (Fts5Expr *)0x0;
    }
    else {
      if ((in_RDI->eDetail != 0) && (in_RDI->eDetail == 1)) {
        in_EDX = in_RDI->nCol;
      }
      *(undefined1 *)((long)pvVar3 + (long)local_48) = 0;
      local_44 = sqlite3Fts5ExprNew(in_RDI,in_ESI,in_EDX,in_RCX,in_R8,pzErr);
    }
    sqlite3_free((void *)0x26c3a2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

static int sqlite3Fts5ExprPattern(
  Fts5Config *pConfig, int bGlob, int iCol, const char *zText, Fts5Expr **pp
){
  i64 nText = strlen(zText);
  char *zExpr = (char*)sqlite3_malloc64(nText*4 + 1);
  int rc = SQLITE_OK;

  if( zExpr==0 ){
    rc = SQLITE_NOMEM;
  }else{
    char aSpec[3];
    int iOut = 0;
    int i = 0;
    int iFirst = 0;

    if( bGlob==0 ){
      aSpec[0] = '_';
      aSpec[1] = '%';
      aSpec[2] = 0;
    }else{
      aSpec[0] = '*';
      aSpec[1] = '?';
      aSpec[2] = '[';
    }

    while( i<=nText ){
      if( i==nText
       || zText[i]==aSpec[0] || zText[i]==aSpec[1] || zText[i]==aSpec[2]
      ){

        if( fts5ExprCountChar(&zText[iFirst], i-iFirst)>=3 ){
          int jj;
          zExpr[iOut++] = '"';
          for(jj=iFirst; jj<i; jj++){
            zExpr[iOut++] = zText[jj];
            if( zText[jj]=='"' ) zExpr[iOut++] = '"';
          }
          zExpr[iOut++] = '"';
          zExpr[iOut++] = ' ';
        }
        if( zText[i]==aSpec[2] ){
          i += 2;
          if( zText[i-1]=='^' ) i++;
          while( i<nText && zText[i]!=']' ) i++;
        }
        iFirst = i+1;
      }
      i++;
    }
    if( iOut>0 ){
      int bAnd = 0;
      if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
        bAnd = 1;
        if( pConfig->eDetail==FTS5_DETAIL_NONE ){
          iCol = pConfig->nCol;
        }
      }
      zExpr[iOut] = '\0';
      rc = sqlite3Fts5ExprNew(pConfig, bAnd, iCol, zExpr, pp,pConfig->pzErrmsg);
    }else{
      *pp = 0;
    }
    sqlite3_free(zExpr);
  }

  return rc;
}